

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::CreateDstUntransferredIntValue
          (GlobOpt *this,int32 min,int32 max,Instr *instr,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ValueType other;
  undefined4 *puVar4;
  Value *pVVar5;
  Value *src2Value_00;
  Opnd *this_00;
  IntConstantBounds local_50;
  Value *local_48;
  Value *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32 [4];
  ValueType valueType;
  
  local_48 = src1Value;
  local_40 = src2Value;
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1689,"(instr)","instr");
    if (!bVar2) goto LAB_004535ea;
    *puVar4 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x168a,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_004535ea;
    *puVar4 = 0;
  }
  bVar2 = OpCodeAttr::ProducesNumber(instr->m_opcode);
  if ((!bVar2) &&
     (((instr->m_opcode != Add_A ||
       (bVar2 = ValueType::IsNumber(&local_48->valueInfo->super_ValueType), !bVar2)) ||
      (bVar2 = ValueType::IsNumber(&local_40->valueInfo->super_ValueType), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x168e,
                       "(OpCodeAttr::ProducesNumber(instr->m_opcode) || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber() && src2Value->GetValueInfo()->IsNumber()))"
                       ,
                       "OpCodeAttr::ProducesNumber(instr->m_opcode) || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber() && src2Value->GetValueInfo()->IsNumber())"
                      );
    if (!bVar2) goto LAB_004535ea;
    *puVar4 = 0;
  }
  IntConstantBounds::IntConstantBounds(&local_50,min,max);
  local_32[0].field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       ValueType::GetInt(true);
  bVar2 = ValueType::IsInt((ValueType *)&local_32[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1691,"(valueType.IsInt())","valueType.IsInt()");
    if (!bVar2) goto LAB_004535ea;
    *puVar4 = 0;
  }
  if (this->prePassLoop == (Loop *)0x0) {
    this_00 = instr->m_dst;
  }
  else {
    src2Value_00 = (Value *)0x0;
    pVVar5 = local_40;
    bVar2 = IsPrepassSrcValueInfoPrecise(this,instr,local_48,local_40,(bool *)0x0);
    local_32[0].field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetPrepassValueTypeForDst(this,local_32[0].field_0,instr,pVVar5,src2Value_00,bVar2,false);
    this_00 = instr->m_dst;
    if (!bVar2) {
      pVVar5 = NewGenericValue(this,(ValueType)local_32[0].field_0,this_00);
      return pVVar5;
    }
  }
  IntConstantBounds::IntConstantBounds(&local_50,min,max);
  other = ValueType::GetInt(true);
  bVar2 = ValueType::operator==((ValueType *)&local_32[0].field_0,other);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x16a0,
                       "(valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()))"
                       ,
                       "valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable())"
                      );
    if (!bVar2) goto LAB_004535ea;
    *puVar4 = 0;
  }
  OVar3 = IR::Opnd::GetKind(this_00);
  if (OVar3 == OpndKindReg) {
    OVar3 = IR::Opnd::GetKind(this_00);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_004535ea;
      *puVar4 = 0;
    }
    if ((*(byte *)((long)this_00[1]._vptr_Opnd + 0x1a) & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x16a1,"(!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec()))",
                         "!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec())");
      if (!bVar2) {
LAB_004535ea:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  pVVar5 = NewIntRangeValue(this,min,max,false,this_00);
  return pVVar5;
}

Assistant:

Value *GlobOpt::CreateDstUntransferredIntValue(
    const int32 min,
    const int32 max,
    IR::Instr *const instr,
    Value *const src1Value,
    Value *const src2Value)
{
    Assert(instr);
    Assert(instr->GetDst());

    Assert(OpCodeAttr::ProducesNumber(instr->m_opcode)
        || (instr->m_opcode == Js::OpCode::Add_A && src1Value->GetValueInfo()->IsNumber()
        && src2Value->GetValueInfo()->IsNumber()));

    ValueType valueType(ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()));
    Assert(valueType.IsInt());
    bool isValueInfoPrecise;
    if(IsLoopPrePass())
    {
        isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value);
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, isValueInfoPrecise);
    }
    else
    {
        isValueInfoPrecise = true;
    }

    IR::Opnd *const dst = instr->GetDst();
    if(isValueInfoPrecise)
    {
        Assert(valueType == ValueType::GetInt(IntConstantBounds(min, max).IsLikelyTaggable()));
        Assert(!(dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->IsTypeSpec()));
        return NewIntRangeValue(min, max, false, dst);
    }
    return NewGenericValue(valueType, dst);
}